

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O2

BasicStringView<char> *
Corrade::Containers::
arrayAppend<Corrade::Containers::BasicStringView<char>,Corrade::Containers::ArrayMallocAllocator<Corrade::Containers::BasicStringView<char>>,Corrade::Containers::BasicStringView<char>>
          (Array<Corrade::Containers::BasicStringView<char>,_void_(*)(Corrade::Containers::BasicStringView<char>_*,_unsigned_long)>
           *array,undefined8 *param_2)

{
  size_t sVar1;
  BasicStringView<char> *pBVar2;
  
  pBVar2 = Implementation::
           arrayGrowBy<Corrade::Containers::BasicStringView<char>,Corrade::Containers::ArrayMallocAllocator<Corrade::Containers::BasicStringView<char>>>
                     (array,1);
  sVar1 = param_2[1];
  pBVar2->_data = (char *)*param_2;
  pBVar2->_sizePlusFlags = sVar1;
  return pBVar2;
}

Assistant:

T& arrayAppend(Array<T>& array, Corrade::InPlaceInitT, Args&&... args) {
    T* const it = Implementation::arrayGrowBy<T, Allocator>(array, 1);
    /* No helper function as there's no way we could memcpy such a thing. */
    /* On GCC 4.8 this includes another workaround, see the 4.8-specific
       overload docs for details */
    Implementation::construct(*it, Utility::forward<Args>(args)...);
    return *it;
}